

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O2

void __thiscall apngasm::APNGAsm::processing_start(APNGAsm *this,void *frame_ptr,bool hasInfo)

{
  pointer pCVar1;
  int iVar2;
  png_structp ppVar3;
  png_infop ppVar4;
  __jmp_buf_tag *__env;
  ulong uVar5;
  uchar header [8];
  
  header[0] = 0x89;
  header[1] = 'P';
  header[2] = 'N';
  header[3] = 'G';
  header[4] = '\r';
  header[5] = '\n';
  header[6] = '\x1a';
  header[7] = '\n';
  ppVar3 = (png_structp)png_create_read_struct("1.6.37",0,0);
  this->_png = ppVar3;
  ppVar4 = (png_infop)png_create_info_struct(ppVar3);
  this->_info = ppVar4;
  if (ppVar4 != (png_infop)0x0 && this->_png != (png_structp)0x0) {
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(this->_png,longjmp,200);
    iVar2 = _setjmp(__env);
    if (iVar2 == 0) {
      png_set_crc_action(this->_png,4);
      uVar5 = 0;
      png_set_progressive_read_fn(this->_png,frame_ptr,info_fn,row_fn,0);
      png_process_data(this->_png,this->_info,header,8);
      png_process_data(this->_png,this->_info,(this->_chunkIHDR).p,(this->_chunkIHDR).size);
      if (hasInfo) {
        for (; pCVar1 = (this->_info_chunks).
                        super__Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>._M_impl.
                        super__Vector_impl_data._M_start,
            uVar5 < (ulong)((long)(this->_info_chunks).
                                  super__Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 4);
            uVar5 = (ulong)((int)uVar5 + 1)) {
          png_process_data(this->_png,this->_info,pCVar1[uVar5].p,pCVar1[uVar5].size);
        }
      }
    }
    else {
      png_destroy_read_struct(&this->_png,&this->_info,0);
    }
  }
  return;
}

Assistant:

void APNGAsm::processing_start(void * frame_ptr, bool hasInfo)
  {
    unsigned char header[8] = {137, 80, 78, 71, 13, 10, 26, 10};

    _png = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
    _info = png_create_info_struct(_png);
    if (!_png || !_info)
      return;

    if (setjmp(png_jmpbuf(_png)))
    {
      png_destroy_read_struct(&_png, &_info, 0);
      return;
    }

    png_set_crc_action(_png, PNG_CRC_QUIET_USE, PNG_CRC_QUIET_USE);
    png_set_progressive_read_fn(_png, frame_ptr, info_fn, row_fn, NULL);
            
    png_process_data(_png, _info, header, 8);
    png_process_data(_png, _info, _chunkIHDR.p, _chunkIHDR.size);

    if (hasInfo)
      for (unsigned int i=0; i<_info_chunks.size(); ++i)
        png_process_data(_png, _info, _info_chunks[i].p, _info_chunks[i].size);
  }